

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeFramesQueue.hpp
# Opt level: O3

bool __thiscall ThreadSafeFramesQueue<cv::Mat>::Pop(ThreadSafeFramesQueue<cv::Mat> *this,Mat *out)

{
  Mat *pMVar1;
  Mat *pMVar2;
  int iVar3;
  int64 iVar4;
  undefined8 uVar5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar3 == 0) {
    pMVar1 = (this->super_queue<cv::Mat,_std::deque<cv::Mat,_std::allocator<cv::Mat>_>_>).c.
             super__Deque_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
    pMVar2 = (this->super_queue<cv::Mat,_std::deque<cv::Mat,_std::allocator<cv::Mat>_>_>).c.
             super__Deque_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    if (pMVar2 != pMVar1) {
      cv::Mat::operator=(out,pMVar1);
      std::deque<cv::Mat,_std::allocator<cv::Mat>_>::pop_front
                ((deque<cv::Mat,_std::allocator<cv::Mat>_> *)this);
      cv::TickMeter::stop(&this->tm);
      iVar4 = cv::getTickCount();
      (this->tm).startTime = iVar4;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return pMVar2 != pMVar1;
  }
  uVar5 = std::__throw_system_error(iVar3);
  __clang_call_terminate(uVar5);
}

Assistant:

bool Pop(T& out) noexcept {
    std::lock_guard<std::mutex> lock(mtx);
    //! if the queue is empty, just exit
    if (this->empty()) {
      return false;
    }
    //! get the first element, and remove it
    out = this->front();
    this->pop();
    //! stop the current timer
    tm.stop();
    //! start the next timer
    tm.start();
    //! return true, indicating successful pop
    return true;
  }